

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

iterator __thiscall
cmLinkedTree<cmDefinitions>::Push_impl
          (cmLinkedTree<cmDefinitions> *this,iterator it,cmDefinitions *t)

{
  iterator __position;
  ulong uVar1;
  iterator iVar2;
  ulong local_18;
  
  local_18 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar1 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar1 != ((long)(this->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0xb6,
                  "iterator cmLinkedTree<cmDefinitions>::Push_impl(iterator, T) [T = cmDefinitions]"
                 );
  }
  if (local_18 <= uVar1) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::push_back(&this->Data,t);
    iVar2.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar2.Tree = this;
    return iVar2;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0xb7,
                "iterator cmLinkedTree<cmDefinitions>::Push_impl(iterator, T) [T = cmDefinitions]");
}

Assistant:

iterator Push_impl(iterator it, T t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(t);
    return iterator(this, this->UpPositions.size());
  }